

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O3

void __thiscall DIS::LinearObjectStatePdu::~LinearObjectStatePdu(LinearObjectStatePdu *this)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__LinearObjectStatePdu_001b5148;
  pLVar1 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar3 = pLVar1;
  if (pLVar2 != pLVar1) {
    do {
      (**pLVar3->_vptr_LinearSegmentParameter)(pLVar3);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar2);
    (this->_linearSegmentParameters).
    super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::~vector
            (&this->_linearSegmentParameters);
  ObjectType::~ObjectType(&this->_objectType);
  SimulationAddress::~SimulationAddress(&this->_receivingID);
  SimulationAddress::~SimulationAddress(&this->_requesterID);
  EntityID::~EntityID(&this->_referencedObjectID);
  EntityID::~EntityID(&this->_objectID);
  SyntheticEnvironmentFamilyPdu::~SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  return;
}

Assistant:

LinearObjectStatePdu::~LinearObjectStatePdu()
{
    _linearSegmentParameters.clear();
}